

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_notif(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  lys_module *plVar1;
  LY_ERR LVar2;
  long local_d8;
  lysp_ext_instance *local_b8;
  lysp_ext_instance *local_a8;
  lysp_ext_instance *local_90;
  lysp_ext_instance *local_80;
  long local_60;
  long local_58;
  long *local_50;
  char *p__;
  uint64_t __u;
  lysp_node *child_p;
  lysc_node_notif *notif;
  lysp_node_notif *notif_p;
  LY_ERR ret;
  lysc_node *node_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  if (pnode[1].parent == (lysp_node *)0x0) {
LAB_00175972:
    notif_p._4_4_ = lysc_unres_must_add(ctx,node,pnode);
    if (notif_p._4_4_ == LY_SUCCESS) {
      for (__u = (uint64_t)pnode[1].name; __u != 0; __u = *(uint64_t *)(__u + 0x10)) {
        LVar2 = lys_compile_node(ctx,(lysp_node *)__u,node,0,(ly_set *)0x0);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      notif_p._4_4_ = lys_compile_node_augments(ctx,node);
    }
  }
  else {
    if (node[1].module == (lys_module *)0x0) {
      local_60 = 0;
    }
    else {
      if (node[1].module == (lys_module *)0x0) {
        local_58 = 0;
      }
      else {
        plVar1 = node[1].module;
        local_58._0_1_ = plVar1[-1].implemented;
        local_58._1_1_ = plVar1[-1].to_compile;
        local_58._2_1_ = plVar1[-1].latest_revision;
        local_58._3_5_ = *(undefined5 *)&plVar1[-1].field_0x7b;
      }
      local_60 = local_58;
    }
    if (node[1].module == (lys_module *)0x0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_90 = (lysp_ext_instance *)0x0;
      }
      else {
        local_90 = pnode[1].parent[-1].exts;
      }
      local_50 = (long *)calloc(1,((long)&local_90->name + local_60) * 0x38 + 8);
      if (local_50 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_notif"
              );
        return LY_EMEM;
      }
    }
    else {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_80 = (lysp_ext_instance *)0x0;
      }
      else {
        local_80 = pnode[1].parent[-1].exts;
      }
      local_50 = (long *)realloc(&node[1].module[-1].implemented,
                                 ((long)&local_80->name +
                                 *(long *)&node[1].module[-1].implemented + local_60) * 0x38 + 8);
      if (local_50 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_notif"
              );
        return LY_EMEM;
      }
    }
    node[1].module = (lys_module *)(local_50 + 1);
    if (node[1].module != (lys_module *)0x0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_a8 = (lysp_ext_instance *)0x0;
      }
      else {
        local_a8 = pnode[1].parent[-1].exts;
      }
      memset(&(node[1].module)->ctx + *local_50 * 7,0,((long)&local_a8->name + local_60) * 0x38);
    }
    p__ = (char *)0x0;
    while( true ) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_b8 = (lysp_ext_instance *)0x0;
      }
      else {
        local_b8 = pnode[1].parent[-1].exts;
      }
      if (local_b8 <= p__) goto LAB_00175972;
      *(long *)&node[1].module[-1].implemented = *(long *)&node[1].module[-1].implemented + 1;
      if (node[1].module == (lys_module *)0x0) {
        local_d8 = 0;
      }
      else {
        plVar1 = node[1].module;
        local_d8._0_1_ = plVar1[-1].implemented;
        local_d8._1_1_ = plVar1[-1].to_compile;
        local_d8._2_1_ = plVar1[-1].latest_revision;
        local_d8._3_5_ = *(undefined5 *)&plVar1[-1].field_0x7b;
      }
      notif_p._4_4_ =
           lys_compile_must(ctx,(lysp_restr *)(pnode[1].parent + (long)p__),
                            (lysc_must *)((long)node[1].module + (local_d8 + -1) * 0x38));
      if (notif_p._4_4_ != LY_SUCCESS) break;
      p__ = p__ + 1;
    }
  }
  return notif_p._4_4_;
}

Assistant:

static LY_ERR
lys_compile_node_notif(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_node_notif *notif_p = (struct lysp_node_notif *)pnode;
    struct lysc_node_notif *notif = (struct lysc_node_notif *)node;
    struct lysp_node *child_p;

    COMPILE_ARRAY_GOTO(ctx, notif_p->musts, notif->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    LY_LIST_FOR(notif_p->child, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

done:
    return ret;
}